

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::OwnFd> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenFileInternal
          (DiskHandle *this,PathPtr path,WriteMode mode,bool append)

{
  DiskHandle *pDVar1;
  String *pSVar2;
  bool bVar3;
  int iVar4;
  WriteMode WVar5;
  size_t sVar6;
  char *__file;
  OwnFd *t;
  undefined4 in_register_0000000c;
  undefined7 in_register_00000081;
  byte in_R9B;
  PathPtr path_00;
  PathPtr path_01;
  OwnFd local_e0 [2];
  OwnFd result;
  Fault f_1;
  Fault local_c8;
  Fault f;
  int error;
  anon_class_40_5_bc53f4ea local_88;
  int local_60;
  int local_5c;
  int _kjSyscallError;
  int newFd;
  String filename;
  mode_t local_38;
  uint local_34;
  mode_t acl;
  uint flags;
  bool append_local;
  String *pSStack_28;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (DiskHandle *)path.parts.size_;
  path_00.parts.ptr = path.parts.ptr;
  flags = (uint)CONCAT71(in_register_00000081,append);
  acl._3_1_ = in_R9B & 1;
  local_34 = 0x80002;
  local_38 = 0x1b6;
  pSStack_28 = path_00.parts.ptr;
  path_local.parts.size_ = (size_t)this;
  bVar3 = has<kj::WriteMode,void>(flags,CREATE);
  if (bVar3) {
    local_34 = local_34 | 0x40;
  }
  bVar3 = has<kj::WriteMode,void>(flags,MODIFY);
  if (!bVar3) {
    bVar3 = has<kj::WriteMode,void>(flags,CREATE);
    if (!bVar3) {
      Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)this);
      return (Maybe<kj::OwnFd>)(NullableValue<kj::OwnFd>)this;
    }
    local_34 = local_34 | 0x80;
  }
  if ((acl._3_1_ & 1) != 0) {
    local_34 = local_34 | 0x400;
  }
  bVar3 = has<kj::WriteMode,void>(flags,EXECUTABLE);
  if (bVar3) {
    local_38 = 0x1ff;
  }
  bVar3 = has<kj::WriteMode,void>(flags,PRIVATE);
  if (bVar3) {
    local_38 = local_38 & 0x1c0;
  }
  PathPtr::toString((String *)&_kjSyscallError,(PathPtr *)&this_local,false);
  local_88.newFd = &local_5c;
  local_88.flags = &local_34;
  local_88.acl = &local_38;
  local_88.this = (DiskHandle *)path_00.parts.ptr;
  local_88.filename = (String *)&_kjSyscallError;
  iVar4 = kj::_::Debug::
          syscallError<kj::(anonymous_namespace)::DiskHandle::tryOpenFileInternal(kj::PathPtr,kj::WriteMode,bool)const::_lambda()_1_>
                    (&local_88,false);
  local_60 = iVar4;
  if (iVar4 == 0) {
    OwnFd::OwnFd(local_e0,local_5c);
    t = mv<kj::OwnFd>(local_e0);
    Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)this,t);
    f.exception._4_4_ = 1;
    OwnFd::~OwnFd(local_e0);
  }
  else if (iVar4 == 2) {
    bVar3 = has<kj::WriteMode,void>(flags,CREATE);
    if (bVar3) {
      bVar3 = has<kj::WriteMode,void>(flags,CREATE_PARENT);
      if ((bVar3) && (sVar6 = PathPtr::size((PathPtr *)&this_local), sVar6 != 0)) {
        path_01 = PathPtr::parent((PathPtr *)&this_local);
        WVar5 = operator|(CREATE,MODIFY);
        WVar5 = operator|(WVar5,CREATE_PARENT);
        bVar3 = tryMkdir((DiskHandle *)path_00.parts.ptr,path_01,WVar5,true);
        pSVar2 = path_local.parts.ptr;
        pDVar1 = this_local;
        if (bVar3) {
          WVar5 = operator-(flags,CREATE_PARENT);
          path_00.parts.size_ = (size_t)pDVar1;
          tryOpenFileInternal(this,path_00,(WriteMode)pSVar2,SUB41(WVar5,0));
          f.exception._4_4_ = 1;
          goto LAB_00388295;
        }
      }
      bVar3 = has<kj::WriteMode,void>(flags,MODIFY);
      if (!bVar3) {
        iVar4 = OwnFd::operator_cast_to_int((OwnFd *)path_00.parts.ptr);
        __file = String::cStr((String *)&_kjSyscallError);
        iVar4 = faccessat(iVar4,__file,0,0x100);
        if (-1 < iVar4) {
          Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)this);
          f.exception._4_4_ = 1;
          goto LAB_00388295;
        }
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::PathPtr&>
                (&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x413,FAILED,(char *)0x0,"\"parent is not a directory\", path",
                 (char (*) [26])"parent is not a directory",(PathPtr *)&this_local);
      Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)this);
      f.exception._4_4_ = 1;
      kj::_::Debug::Fault::~Fault(&local_c8);
    }
    else {
      Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)this);
      f.exception._4_4_ = 1;
    }
  }
  else {
    if (iVar4 == 0x11) {
      bVar3 = has<kj::WriteMode,void>(flags,MODIFY);
      if (!bVar3) {
        Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)this);
        f.exception._4_4_ = 1;
        goto LAB_00388295;
      }
    }
    else if ((iVar4 == 0x14) && (bVar3 = has<kj::WriteMode,void>(flags,CREATE), !bVar3)) {
      Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)this);
      f.exception._4_4_ = 1;
      goto LAB_00388295;
    }
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x426,iVar4,"openat(fd, path, O_RDWR | ...)","path",(PathPtr *)&this_local);
    Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)this);
    f.exception._4_4_ = 1;
    kj::_::Debug::Fault::~Fault((Fault *)&result);
  }
LAB_00388295:
  String::~String((String *)&_kjSyscallError);
  return (Maybe<kj::OwnFd>)(NullableValue<kj::OwnFd>)this;
}

Assistant:

Maybe<OwnFd> tryOpenFileInternal(PathPtr path, WriteMode mode, bool append) const {
    uint flags = O_RDWR | MAYBE_O_CLOEXEC;
    mode_t acl = 0666;
    if (has(mode, WriteMode::CREATE)) {
      flags |= O_CREAT;
    }
    if (!has(mode, WriteMode::MODIFY)) {
      if (!has(mode, WriteMode::CREATE)) {
        // Neither CREATE nor MODIFY -- impossible to satisfy preconditions.
        return kj::none;
      }
      flags |= O_EXCL;
    }
    if (append) {
      flags |= O_APPEND;
    }
    if (has(mode, WriteMode::EXECUTABLE)) {
      acl = 0777;
    }
    if (has(mode, WriteMode::PRIVATE)) {
      acl &= 0700;
    }

    auto filename = path.toString();

    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(fd, filename.cStr(), flags, acl)) {
      case ENOENT:
        if (has(mode, WriteMode::CREATE)) {
          // Either:
          // - The file is a broken symlink.
          // - A parent directory didn't exist.
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryOpenFileInternal(path, mode - WriteMode::CREATE_PARENT, append);
          }

          // Check for broken link.
          if (!has(mode, WriteMode::MODIFY) &&
              faccessat(fd, filename.cStr(), F_OK, AT_SYMLINK_NOFOLLOW) >= 0) {
            // Yep. We treat this as already-exists, which means in CREATE-only mode this is a
            // simple failure.
            return kj::none;
          }

          KJ_FAIL_REQUIRE("parent is not a directory", path) { return kj::none; }
        } else {
          // MODIFY-only mode. ENOENT = doesn't exist = return null.
          return kj::none;
        }
      case ENOTDIR:
        if (!has(mode, WriteMode::CREATE)) {
          // MODIFY-only mode. ENOTDIR = parent not a directory = doesn't exist = return null.
          return kj::none;
        }
        goto failed;
      case EEXIST:
        if (!has(mode, WriteMode::MODIFY)) {
          // CREATE-only mode. EEXIST = already exists = return null.
          return kj::none;
        }
        goto failed;
      default:
      failed:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDWR | ...)", error, path) { return kj::none; }
    }

    kj::OwnFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return kj::mv(result);
  }